

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

SURFACE_TRANSFORM
Diligent::VkSurfaceTransformFlagToSurfaceTransform(VkSurfaceTransformFlagBitsKHR vkTransformFlag)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  VkSurfaceTransformFlagBitsKHR vkTransformFlag_local;
  
  msg.field_2._8_4_ = vkTransformFlag;
  bVar1 = IsPowerOfTwo<unsigned_int>(vkTransformFlag);
  if (!bVar1) {
    FormatString<char[38]>
              ((string *)local_30,(char (*) [38])"Only single transform bit is expected");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"VkSurfaceTransformFlagToSurfaceTransform",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x5e6);
    std::__cxx11::string::~string((string *)local_30);
  }
  if (msg.field_2._8_4_ == 1) {
    msg.field_2._12_4_ = 1;
  }
  else if (msg.field_2._8_4_ == 2) {
    msg.field_2._12_4_ = 2;
  }
  else if (msg.field_2._8_4_ == 4) {
    msg.field_2._12_4_ = 3;
  }
  else if (msg.field_2._8_4_ == 8) {
    msg.field_2._12_4_ = 4;
  }
  else if (msg.field_2._8_4_ == 0x10) {
    msg.field_2._12_4_ = 5;
  }
  else if (msg.field_2._8_4_ == 0x20) {
    msg.field_2._12_4_ = 6;
  }
  else if (msg.field_2._8_4_ == 0x40) {
    msg.field_2._12_4_ = 7;
  }
  else if (msg.field_2._8_4_ == 0x80) {
    msg.field_2._12_4_ = 8;
  }
  else {
    FormatString<char[29]>((string *)local_60,(char (*) [29])"Unexpected surface transform");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"VkSurfaceTransformFlagToSurfaceTransform",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x5f5);
    std::__cxx11::string::~string((string *)local_60);
    msg.field_2._12_4_ = 1;
  }
  return msg.field_2._12_4_;
}

Assistant:

SURFACE_TRANSFORM VkSurfaceTransformFlagToSurfaceTransform(VkSurfaceTransformFlagBitsKHR vkTransformFlag)
{
    VERIFY(IsPowerOfTwo(static_cast<Uint32>(vkTransformFlag)), "Only single transform bit is expected");

    // clang-format off
    switch (vkTransformFlag)
    {
        case VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR:                     return SURFACE_TRANSFORM_IDENTITY;
        case VK_SURFACE_TRANSFORM_ROTATE_90_BIT_KHR:                    return SURFACE_TRANSFORM_ROTATE_90;
        case VK_SURFACE_TRANSFORM_ROTATE_180_BIT_KHR:                   return SURFACE_TRANSFORM_ROTATE_180;
        case VK_SURFACE_TRANSFORM_ROTATE_270_BIT_KHR:                   return SURFACE_TRANSFORM_ROTATE_270;
        case VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_BIT_KHR:            return SURFACE_TRANSFORM_HORIZONTAL_MIRROR;
        case VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90_BIT_KHR:  return SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90;
        case VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180_BIT_KHR: return SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180;
        case VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270_BIT_KHR: return SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270;

        default:
            UNEXPECTED("Unexpected surface transform");
            return SURFACE_TRANSFORM_IDENTITY;
    }
    // clang-format on
}